

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

void __thiscall GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<2UL>::NewBucket(Geobucket<2UL> *this)

{
  vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  *this_00;
  reference this_01;
  reference this_02;
  vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
  *in_RDI;
  size_t size;
  MOGrevlex<6UL> *in_stack_ffffffffffffffc8;
  size_type in_stack_ffffffffffffffe8;
  
  this_00 = (vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
             *)std::
               vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
               ::size(in_RDI);
  std::
  vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>::
  resize(this_00,in_stack_ffffffffffffffe8);
  this_01 = std::
            vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
            ::operator[](in_RDI,(size_type)this_00);
  this_02 = std::
            vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
            ::operator[](in_RDI,(size_type)
                                ((long)&this_00[-1].
                                        super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  GetOrder(this_02);
  SetOrder(this_01,in_stack_ffffffffffffffc8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 1),
             (size_type)
             ((long)&this_00[-1].
                     super__Vector_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01,
             (value_type_conflict1 *)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void NewBucket()
		{
			size_t size = (size_t)_buckets.size();
			_buckets.resize(size + 1);
			_buckets[size].SetOrder(_buckets[size - 1].GetOrder());
			_maxsizes.push_back(_d * _maxsizes[size - 1]);
		}